

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solid.cpp
# Opt level: O2

Vertex * __thiscall MeshLib::Solid::edgeSplit(Solid *this,Edge *e)

{
  int iVar1;
  Face *pFVar2;
  Edge *pEVar3;
  HalfEdge *pHVar4;
  ListNode<MeshLib::Face> *pLVar5;
  tVertex pVVar6;
  int i;
  tVertex pVVar7;
  long lVar8;
  tFace pFVar9;
  HalfEdge *pHVar10;
  HalfEdge *pHVar11;
  int iVar12;
  int iVar13;
  List<MeshLib::Face> *this_00;
  tHalfEdge pHVar14;
  int j;
  long lVar15;
  bool bVar16;
  tVertex w [3];
  int vid [3];
  tHalfEdge hes [2];
  List<MeshLib::Face> new_faces;
  tVertex v [3];
  TreeIterator<MeshLib::Face> fiter;
  TreeIterator<MeshLib::Vertex> viter;
  
  AVL::TreeIterator<MeshLib::Vertex>::TreeIterator(&viter,&this->m_verts);
  iVar12 = -1;
  while (viter.m_finished == false) {
    iVar13 = (viter.m_pointer)->data->m_id;
    if (iVar12 <= iVar13) {
      iVar12 = iVar13;
    }
    AVL::TreeIterator<MeshLib::Vertex>::operator++(&viter);
  }
  AVL::TreeIterator<MeshLib::Face>::TreeIterator(&fiter,&this->m_faces);
  iVar13 = -1;
  while (fiter.m_finished == false) {
    iVar1 = (fiter.m_pointer)->data->m_id;
    if (iVar13 <= iVar1) {
      iVar13 = iVar1;
    }
    AVL::TreeIterator<MeshLib::Face>::operator++(&fiter);
  }
  pVVar7 = createVertex(this,iVar12 + 1);
  hes[0] = e->m_halfedge[0];
  hes[1] = e->m_halfedge[1];
  pVVar7->m_boundary = hes[1] == (HalfEdge *)0x0;
  AVL::Tree<MeshLib::Edge>::remove(&this->m_edges,(char *)e);
  this_00 = &new_faces;
  new_faces.m_head = (ListNode<MeshLib::Face> *)0x0;
  new_faces.m_size = 0;
  for (lVar15 = 0; lVar15 != 2; lVar15 = lVar15 + 1) {
    pHVar14 = hes[lVar15];
    if (pHVar14 != (tHalfEdge)0x0) {
      pFVar2 = pHVar14->m_face;
      AVL::Tree<MeshLib::Face>::remove(&this->m_faces,(char *)pFVar2);
      if (pFVar2 != (Face *)0x0) {
        std::__cxx11::string::~string((string *)&pFVar2->m_string);
      }
      operator_delete(pFVar2);
      for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
        v[lVar8] = pHVar14->m_vertex;
        pEVar3 = pHVar14->m_edge;
        if (pEVar3->m_halfedge[0] == pHVar14) {
          pEVar3->m_halfedge[0] = pEVar3->m_halfedge[1];
        }
        pEVar3->m_halfedge[1] = (HalfEdge *)0x0;
        pHVar14 = pHVar14->m_next;
      }
      iVar12 = 3;
      while (pVVar6 = v[1], bVar16 = iVar12 != 0, iVar12 = iVar12 + -1, bVar16) {
        pHVar10 = pHVar14->m_next;
        std::__cxx11::string::~string((string *)&pHVar14->m_string);
        operator_delete(pHVar14);
        pHVar14 = pHVar10;
      }
      w[0] = pVVar7;
      w[1] = v[0];
      w[2] = v[1];
      for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
        vid[lVar8] = w[lVar8]->m_id;
      }
      pFVar9 = createFace(this,vid,iVar13 + 1);
      List<MeshLib::Face>::Append(this_00,pFVar9);
      w[0] = pVVar7;
      w[1] = pVVar6;
      w[2] = v[2];
      for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
        vid[lVar8] = w[lVar8]->m_id;
      }
      iVar13 = iVar13 + 2;
      pFVar9 = createFace(this,vid,iVar13);
      List<MeshLib::Face>::Append(this_00,pFVar9);
    }
  }
  while (pLVar5 = this_00->m_head, pLVar5 != (ListNode<MeshLib::Face> *)0x0) {
    pFVar2 = pLVar5->m_data;
    pHVar10 = pFVar2->m_halfedge;
    pHVar11 = pHVar10;
    do {
      pEVar3 = pHVar10->m_edge;
      if ((pEVar3->m_halfedge[1] != (HalfEdge *)0x0) &&
         (pHVar4 = pEVar3->m_halfedge[0], pHVar4->m_vertex->m_id < pHVar4->m_prev->m_vertex->m_id))
      {
        pEVar3->m_halfedge[0] = pEVar3->m_halfedge[1];
        pEVar3->m_halfedge[1] = pHVar4;
        pHVar11 = pFVar2->m_halfedge;
      }
      pHVar10 = pHVar10->m_next;
    } while (pHVar10 != pHVar11);
    this_00 = (List<MeshLib::Face> *)&pLVar5->m_next;
  }
  std::__cxx11::string::~string((string *)&e->m_string);
  operator_delete(e);
  List<MeshLib::Face>::~List(&new_faces);
  return pVVar7;
}

Assistant:

Vertex * Solid::edgeSplit( Edge * e )
{
	//find the max_id for vertices;

	AVL::TreeIterator<Vertex> viter(m_verts);

	int max_vid = -1;

	for( ; !viter.end(); ++viter )
	{
		max_vid = ( max_vid > (*viter)->id() )? max_vid: (*viter)->id();
	}

	AVL::TreeIterator<Face> fiter(m_faces);

	int max_fid = -1;

	for( ; !fiter.end(); ++fiter )
	{
		max_fid = ( max_fid > (*fiter)->id() )? max_fid: (*fiter)->id();
	}

	//create a new vertex

	tVertex nv = createVertex( ++max_vid );

	tHalfEdge hes[2];
	hes[0] = e->halfedge(0);
	hes[1] = e->halfedge(1);

	nv->boundary() = (hes[1]==NULL);

	m_edges.remove( e );


	List<Face> new_faces;

	for( int j = 0; j < 2; j ++ )
	{
		tVertex v[3];
		tHalfEdge he = hes[j];

		if( he == NULL ) continue;

		tFace  f = he->face();
		m_faces.remove( f );
		delete f;

		for( int i = 0; i < 3; i ++ )
		{
			v[i] = he->target();
			
			tEdge te = he->edge();
			if( te->halfedge(0) == he )
			{
				te->halfedge(0) = te->halfedge(1);
			}
			te->halfedge(1) = NULL;

			he = he->he_next();
		}

		int k;
		for( k = 0; k < 3; k ++ )
		{
			tHalfEdge ne = he->he_next();
			delete he;
			he = ne;
		}

		int vid[3];
		tVertex w[3];
		w[0] = nv; w[1] = v[0]; w[2] = v[1];
		for( k = 0; k < 3; k ++ )
		{
			vid[k] = w[k]->id(); 
		}		

		Face * nf = createFace( vid, ++max_fid );
		new_faces.Append( nf );

		w[0] = nv; w[1] = v[1]; w[2] = v[2];
		for( k = 0; k < 3; k ++ )
		{
			vid[k] = w[k]->id(); 
		}	
		nf = createFace( vid, ++ max_fid );
		new_faces.Append( nf );
	}	


	for( ListIterator<Face> iter( new_faces ); !iter.end(); ++ iter )
	{
		Face * f = *iter;
		HalfEdge * he = f->halfedge();

		do{
			Edge     * e = he->edge();
			if( e->halfedge(1) != NULL )
			{
				HalfEdge * h = e->halfedge(0);
				if( h->target()->id() < h->source()->id() )
				{
					e->halfedge(0) = e->halfedge(1);
					e->halfedge(1) = h;
				}
			}
			he = he->he_next();
		}while( he != f->halfedge() );
	}

	delete e;
	return nv;	
}